

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cpp
# Opt level: O2

int __thiscall Map_Chest::DelItem(Map_Chest *this,short item_id)

{
  list<Map_Chest_Item,_std::allocator<Map_Chest_Item>_> *this_00;
  int iVar1;
  _List_node_base *p_Var2;
  const_iterator __position;
  _List_node_base *p_Var3;
  
  this_00 = &this->items;
  __position._M_node = (_List_node_base *)this_00;
  do {
    __position._M_node = (__position._M_node)->_M_next;
    if (__position._M_node == (_List_node_base *)this_00) {
      return 0;
    }
  } while (*(short *)&__position._M_node[1]._M_next != item_id);
  iVar1 = *(int *)((long)&__position._M_node[1]._M_next + 4);
  if (*(int *)&__position._M_node[1]._M_prev != 0) {
    p_Var3 = (_List_node_base *)Timer::GetTime();
    p_Var2 = (_List_node_base *)&this->spawns;
    while (p_Var2 = (((_List_base<Map_Chest_Spawn,_std::allocator<Map_Chest_Spawn>_> *)
                     &p_Var2->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
          p_Var2 != (_List_node_base *)&this->spawns) {
      if (*(int *)&p_Var2[2]._M_next == *(int *)&__position._M_node[1]._M_prev) {
        p_Var2[2]._M_prev = p_Var3;
      }
    }
  }
  std::__cxx11::list<Map_Chest_Item,_std::allocator<Map_Chest_Item>_>::erase(this_00,__position);
  return iVar1;
}

Assistant:

int Map_Chest::DelItem(short item_id)
{
	UTIL_IFOREACH(this->items, it)
	{
		if (it->id == item_id)
		{
			int amount = it->amount;

			if (it->slot)
			{
				double current_time = Timer::GetTime();

				UTIL_FOREACH_REF(this->spawns, spawn)
				{
					if (spawn.slot == it->slot)
					{
						spawn.last_taken = current_time;
					}
				}
			}

			this->items.erase(it);
			return amount;
		}
	}

	return 0;
}